

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O1

void __thiscall embree::TutorialApplication::create_device(TutorialApplication *this)

{
  RTCError code;
  RTCDevice userPtr;
  
  userPtr = (RTCDevice)rtcNewDevice((this->super_Application).rtcore._M_dataplus._M_p);
  g_device = userPtr;
  code = rtcGetDeviceError();
  error_handler(userPtr,code,(char *)0x0);
  rtcSetDeviceErrorFunction(g_device,error_handler,0);
  return;
}

Assistant:

void TutorialApplication::create_device()
  {
#if defined(EMBREE_SYCL_SUPPORT) && defined(EMBREE_SYCL_TUTORIAL)

    /* create SYCL device */
    if (features & FEATURE_SYCL)
    {
      if (jit_cache)
      {
        /* enable SYCL JIT caching */
        FileName exe = getExecutableFileName();
        FileName cache_dir = exe.path() + FileName("cache");
        
#if defined(__WIN32__)
        _putenv_s("SYCL_CACHE_PERSISTENT","1");
        _putenv_s("SYCL_CACHE_DIR",cache_dir.c_str());
#else
        setenv("SYCL_CACHE_PERSISTENT","1",1);
        setenv("SYCL_CACHE_DIR",cache_dir.c_str(),1);
#endif
      }

      auto exception_handler = [](sycl::exception_list exceptions)
      {
        for (std::exception_ptr const &e : exceptions) {
          try {
            std::rethrow_exception(e);
          } catch (sycl::exception const &e) {
            std::cout << "ERROR: Caught asynchronous SYCL exception:\n"
                      << e.what() << std::endl;
            exit(1);
          }
        }
      };

      /* select device supported by Embree */
      try {
        device = new sycl::device(rtcSYCLDeviceSelector);
      } catch(std::exception& e) {
        std::cerr << "Caught exception creating sycl::device: " << e.what() << std::endl;
        printAllSYCLDevices();
        throw;
      }
      sycl::platform platform = device->get_platform();
      log(1, "Selected SYCL Platform: " + platform.get_info<sycl::info::platform::name>());
      log(1, "Selected SYCL Device: " + device->get_info<sycl::info::device::name>());

      context = new sycl::context(*device);
      queue = new sycl::queue(*context, *device, exception_handler, { sycl::property::queue::in_order(), sycl::property::queue::enable_profiling() });
      g_device = rtcNewSYCLDevice(*context,rtcore.c_str());
      error_handler(nullptr,rtcGetDeviceError(g_device),rtcGetDeviceLastErrorMessage(g_device));
      global_gpu_device = device;
      global_gpu_context = context;
      global_gpu_queue = queue;

      if (verbosity >= 1) {
        printAllSYCLDevices();
      }

      enableUSMAllocTutorial(global_gpu_context, global_gpu_device);
    }

    /* create standard device */
    else
#endif
      
    {
      g_device = rtcNewDevice(rtcore.c_str());
      error_handler(nullptr,rtcGetDeviceError(g_device));
    }
    
    /* set error handler */
    rtcSetDeviceErrorFunction(g_device,error_handler,nullptr);
  }